

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O1

int jpc_ft_analyze(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  jpc_fix_t *pjVar1;
  int iVar2;
  jpc_fix_t *pjVar3;
  jpc_fix_t *pjVar4;
  jpc_fix_t *pjVar5;
  long *plVar6;
  jpc_fix_t *pjVar7;
  long lVar8;
  long *plVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  jpc_fix_t *pjVar13;
  ulong uVar14;
  long *plVar15;
  jpc_fix_t *pjVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  jpc_fix_t *pjVar21;
  uint uVar22;
  bool bVar23;
  uint local_80;
  uint local_70;
  uint local_68;
  
  uVar18 = ystart & 1;
  local_68 = width & 0xfffffff0;
  pjVar13 = a;
  if ((width & 0xfffffff0U) != 0) {
    uVar10 = (height - uVar18) + 1 >> 1;
    uVar14 = (ulong)(uVar10 * stride);
    local_70 = height & 1;
    bVar23 = (height & 1U) == uVar18;
    iVar12 = ((height - uVar18) - uVar10) - (uint)bVar23;
    iVar11 = (uVar10 - (uVar18 == 0)) - (uint)!bVar23;
    pjVar7 = a + uVar14;
    pjVar16 = a + (uint)stride;
    pjVar21 = a + (uint)stride + uVar14;
    uVar10 = 0;
    do {
      jpc_qmfb_split_colgrp(pjVar13,height,stride,uVar18);
      if ((uint)height < 2) {
        if (uVar18 != 0) {
          lVar8 = 0;
          do {
            pjVar13[lVar8] = (long)((int)pjVar13[lVar8] * 2);
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
        }
      }
      else {
        pjVar5 = pjVar13 + uVar14;
        iVar2 = iVar12;
        pjVar1 = pjVar5;
        pjVar3 = pjVar16;
        pjVar4 = pjVar13;
        if (uVar18 != 0) {
          lVar8 = 0;
          do {
            pjVar7[lVar8] = pjVar7[lVar8] - pjVar13[lVar8];
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          pjVar1 = pjVar5 + (uint)stride;
        }
        for (; iVar2 != 0; iVar2 = iVar2 + -1) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] = pjVar1[lVar8] - (long)(int)((ulong)(pjVar3[lVar8] + pjVar4[lVar8]) >> 1)
            ;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          pjVar1 = pjVar1 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
        }
        if (local_70 == uVar18) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] = pjVar1[lVar8] - pjVar4[lVar8];
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
        }
        iVar2 = iVar11;
        pjVar1 = pjVar13;
        pjVar3 = pjVar7;
        pjVar4 = pjVar21;
        if (uVar18 == 0) {
          lVar8 = 0;
          do {
            pjVar13[lVar8] = pjVar13[lVar8] + (pjVar7[lVar8] * 0x80000000 + 0x80000000 >> 0x20);
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          pjVar1 = pjVar13 + (uint)stride;
        }
        for (; iVar2 != 0; iVar2 = iVar2 + -1) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] =
                 pjVar1[lVar8] + ((pjVar4[lVar8] + pjVar3[lVar8]) * 0x40000000 + 0x80000000 >> 0x20)
            ;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          pjVar5 = pjVar3 + (uint)stride;
          pjVar1 = pjVar1 + (uint)stride;
          pjVar3 = pjVar5;
          pjVar4 = pjVar4 + (uint)stride;
        }
        if (local_70 != uVar18) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] = pjVar1[lVar8] + (pjVar5[lVar8] * 0x80000000 + 0x80000000 >> 0x20);
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
        }
      }
      pjVar13 = pjVar13 + 0x10;
      uVar10 = uVar10 + 0x10;
      pjVar7 = pjVar7 + 0x10;
      pjVar16 = pjVar16 + 0x10;
      pjVar21 = pjVar21 + 0x10;
    } while (uVar10 < local_68);
  }
  if (local_68 != width) {
    uVar10 = width & 0xf;
    jpc_qmfb_split_colres(pjVar13,height,uVar10,stride,uVar18);
    if ((uint)height < 2) {
      if (uVar10 != 0 && uVar18 != 0) {
        lVar8 = 0;
        do {
          pjVar13[lVar8] = (long)((int)pjVar13[lVar8] * 2);
          lVar8 = lVar8 + 1;
        } while (uVar10 != (uint)lVar8);
      }
    }
    else {
      uVar17 = (uVar18 ^ 1) + height >> 1;
      pjVar7 = pjVar13 + uVar17 * stride;
      pjVar16 = pjVar7;
      if (uVar18 != 0) {
        if (uVar10 != 0) {
          lVar8 = 0;
          do {
            pjVar7[lVar8] = pjVar7[lVar8] - pjVar13[lVar8];
            lVar8 = lVar8 + 1;
          } while (uVar10 != (uint)lVar8);
        }
        pjVar16 = pjVar7 + (uint)stride;
      }
      uVar20 = height & 1;
      pjVar21 = pjVar13;
      pjVar5 = pjVar13;
      for (iVar11 = (height - (uVar18 + uVar17)) - (uint)(uVar20 == uVar18); iVar11 != 0;
          iVar11 = iVar11 + -1) {
        pjVar5 = pjVar5 + (uint)stride;
        if (uVar10 != 0) {
          lVar8 = 0;
          do {
            pjVar16[lVar8] =
                 pjVar16[lVar8] - (long)(int)((ulong)(pjVar5[lVar8] + pjVar21[lVar8]) >> 1);
            lVar8 = lVar8 + 1;
          } while (uVar10 != (uint)lVar8);
        }
        pjVar16 = pjVar16 + (uint)stride;
        pjVar21 = pjVar21 + (uint)stride;
      }
      if (uVar10 != 0 && uVar20 == uVar18) {
        lVar8 = 0;
        do {
          pjVar16[lVar8] = pjVar16[lVar8] - pjVar21[lVar8];
          lVar8 = lVar8 + 1;
        } while (uVar10 != (uint)lVar8);
      }
      pjVar16 = pjVar13;
      if (uVar18 == 0) {
        if (uVar10 != 0) {
          lVar8 = 0;
          do {
            pjVar13[lVar8] = pjVar13[lVar8] + (pjVar7[lVar8] * 0x80000000 + 0x80000000 >> 0x20);
            lVar8 = lVar8 + 1;
          } while (uVar10 != (uint)lVar8);
        }
        pjVar16 = pjVar13 + (uint)stride;
      }
      iVar11 = (uVar17 - (uVar18 == 0)) - (uint)(uVar20 != uVar18);
      if (iVar11 != 0) {
        pjVar13 = pjVar13 + (ulong)(uint)stride + (ulong)(uVar17 * stride);
        do {
          if (uVar10 != 0) {
            lVar8 = 0;
            do {
              pjVar16[lVar8] =
                   pjVar16[lVar8] +
                   ((pjVar13[lVar8] + pjVar7[lVar8]) * 0x40000000 + 0x80000000 >> 0x20);
              lVar8 = lVar8 + 1;
            } while (uVar10 != (uint)lVar8);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar7 = pjVar7 + (uint)stride;
          pjVar13 = pjVar13 + (uint)stride;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      if (uVar10 != 0 && uVar20 != uVar18) {
        lVar8 = 0;
        do {
          pjVar16[lVar8] = pjVar16[lVar8] + (pjVar7[lVar8] * 0x80000000 + 0x80000000 >> 0x20);
          lVar8 = lVar8 + 1;
        } while (uVar10 != (uint)lVar8);
      }
    }
  }
  if (height != 0) {
    uVar20 = xstart & 1;
    uVar17 = (uVar20 ^ 1) + width >> 1;
    local_80 = width & 1;
    bVar23 = (width & 1U) == uVar20;
    uVar10 = (uint)bVar23;
    uVar18 = (uint)((xstart & 1U) == 0);
    uVar22 = (uint)!bVar23;
    pjVar13 = a + uVar17;
    iVar11 = 0;
    do {
      jpc_qmfb_split_row(a,width,uVar20);
      if ((uint)width < 2) {
        if ((xstart & 1U) != 0) {
          *a = (long)((int)*a * 2);
        }
      }
      else {
        plVar6 = a + uVar17;
        plVar9 = plVar6;
        if ((xstart & 1U) != 0) {
          *plVar6 = *plVar6 - *a;
          plVar9 = plVar6 + 1;
        }
        plVar15 = a;
        if ((width - uVar20) - uVar17 != uVar10) {
          lVar19 = 0;
          lVar8 = 0;
          do {
            plVar9[lVar8] = plVar9[lVar8] - (long)(int)((ulong)(a[lVar8 + 1] + a[lVar8]) >> 1);
            lVar8 = lVar8 + 1;
            lVar19 = lVar19 + -8;
          } while (((width - uVar10) - uVar17) - uVar20 != (int)lVar8);
          plVar9 = (long *)((long)plVar9 - lVar19);
          plVar15 = (long *)((long)a - lVar19);
        }
        if (local_80 == uVar20) {
          *plVar9 = *plVar9 - *plVar15;
        }
        plVar9 = a;
        if ((xstart & 1U) == 0) {
          *a = *a + (*plVar6 * 0x80000000 + 0x80000000 >> 0x20);
          plVar9 = a + 1;
        }
        if (uVar17 - uVar18 != uVar22) {
          lVar19 = 0;
          lVar8 = 0;
          do {
            plVar9[lVar8] =
                 plVar9[lVar8] +
                 ((pjVar13[lVar8 + 1] + pjVar13[lVar8]) * 0x40000000 + 0x80000000 >> 0x20);
            lVar8 = lVar8 + 1;
            lVar19 = lVar19 + -8;
          } while ((uVar22 - uVar17) + uVar18 + (int)lVar8 != 0);
          plVar9 = (long *)((long)plVar9 - lVar19);
          plVar6 = (long *)((long)pjVar13 - lVar19);
        }
        if (local_80 != uVar20) {
          *plVar9 = *plVar9 + (*plVar6 * 0x80000000 + 0x80000000 >> 0x20);
        }
      }
      a = a + stride;
      iVar11 = iVar11 + 1;
      pjVar13 = pjVar13 + stride;
    } while (iVar11 != height);
  }
  return 0;
}

Assistant:

int jpc_ft_analyze(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{
	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_qmfb_split_colgrp(startptr, numrows, stride, rowparity);
		jpc_ft_fwdlift_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_qmfb_split_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_ft_fwdlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_qmfb_split_row(startptr, numcols, colparity);
		jpc_ft_fwdlift_row(startptr, numcols, colparity);
		startptr += stride;
	}

	return 0;

}